

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

ScenarioLowerBound * __thiscall
despot::BaseRockSample::CreateScenarioLowerBound
          (BaseRockSample *this,string *name,string *particle_bound_name)

{
  pointer pcVar1;
  int iVar2;
  TrivialParticleLowerBound *this_00;
  RandomPolicy *this_01;
  ParticleLowerBound *pPVar3;
  ScenarioLowerBound *this_02;
  undefined **ppuVar4;
  RockSampleMMAPStateScenarioLowerBound *this_03;
  ostream *poVar5;
  BeliefMDP *pBVar6;
  long *local_40 [2];
  long local_30 [2];
  
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 == 0) {
    this_00 = (TrivialParticleLowerBound *)operator_new(0x10);
    despot::TrivialParticleLowerBound::TrivialParticleLowerBound
              (this_00,(DSPOMDP *)&this->super_BeliefMDP);
    return (ScenarioLowerBound *)this_00;
  }
  iVar2 = std::__cxx11::string::compare((char *)name);
  if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)name), iVar2 == 0)) {
    this_02 = (ScenarioLowerBound *)operator_new(0x20);
    despot::ScenarioLowerBound::ScenarioLowerBound(this_02,(DSPOMDP *)&this->super_BeliefMDP);
    ppuVar4 = &PTR__ScenarioLowerBound_0011a840;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 == 0) {
      this_01 = (RandomPolicy *)operator_new(0x38);
      pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
      pBVar6 = &this->super_BeliefMDP;
      pPVar3 = (ParticleLowerBound *)(**(code **)(*(long *)pBVar6 + 0x70))(pBVar6,local_40);
      despot::RandomPolicy::RandomPolicy(this_01,(DSPOMDP *)pBVar6,pPVar3);
      if (local_40[0] == local_30) {
        return (ScenarioLowerBound *)this_01;
      }
      operator_delete(local_40[0],local_30[0] + 1);
      return (ScenarioLowerBound *)this_01;
    }
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)name);
      if (iVar2 == 0) {
        this_03 = (RockSampleMMAPStateScenarioLowerBound *)operator_new(0x38);
        RockSampleMMAPStateScenarioLowerBound::RockSampleMMAPStateScenarioLowerBound
                  (this_03,(DSPOMDP *)&this->super_BeliefMDP);
        return &this_03->super_ScenarioLowerBound;
      }
      iVar2 = std::__cxx11::string::compare((char *)name);
      if (iVar2 == 0) {
        return (ScenarioLowerBound *)0x0;
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,"Unsupported lower bound algorithm: ");
      poVar5 = std::operator<<(poVar5,(string *)name);
      std::endl<char,std::char_traits<char>>(poVar5);
      exit(0);
    }
    this_02 = (ScenarioLowerBound *)operator_new(0x20);
    despot::ScenarioLowerBound::ScenarioLowerBound(this_02,(DSPOMDP *)&this->super_BeliefMDP);
    ppuVar4 = &PTR__ScenarioLowerBound_0011a898;
  }
  *(undefined ***)this_02 = ppuVar4;
  *(BaseRockSample **)(this_02 + 0x10) = this;
  *(Grid<int> **)(this_02 + 0x18) = &this->grid_;
  return this_02;
}

Assistant:

ScenarioLowerBound* BaseRockSample::CreateScenarioLowerBound(string name, string
	particle_bound_name) const {
	if (name == "TRIVIAL") {
		return new TrivialParticleLowerBound(this);
	} else if (name == "DEFAULT" || name == "EAST") {
		// scenario_lower_bound_ = new BlindPolicy(this, Compass::EAST);
		return new RockSampleEastScenarioLowerBound(this);
	} else if (name == "RANDOM") {
		return new RandomPolicy(this,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "ENT") {
		return new RockSampleENTScenarioLowerBound(this);
	} else if (name == "MMAP") {
		return new RockSampleMMAPStateScenarioLowerBound(this);
	} else if (name == "MODE") {
		// scenario_lower_bound_ = new ModeStatePolicy(this);
		return NULL; // TODO
	} else {
		cerr << "Unsupported lower bound algorithm: " << name << endl;
		exit(0);
		return NULL;
	}
}